

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

PC * __thiscall Hpipe::Context::keep_up_to(PC *__return_storage_ptr__,Context *this,uint n)

{
  CharItem **ppCVar1;
  uint local_b4;
  undefined1 local_b0 [4];
  uint i;
  PcMaker pm;
  uint n_local;
  Context *this_local;
  
  pm.orig._4_4_ = n;
  anon_unknown_7::PcMaker::PcMaker((PcMaker *)local_b0,this);
  for (local_b4 = 0; local_b4 <= pm.orig._4_4_; local_b4 = local_b4 + 1) {
    ppCVar1 = Vec<const_Hpipe::CharItem_*>::operator[](&this->pos,local_b4);
    anon_unknown_7::PcMaker::add((PcMaker *)local_b0,*ppCVar1,local_b4,true);
  }
  anon_unknown_7::PcMaker::out(__return_storage_ptr__,(PcMaker *)local_b0);
  anon_unknown_7::PcMaker::~PcMaker((PcMaker *)local_b0);
  return __return_storage_ptr__;
}

Assistant:

Context::PC Context::keep_up_to( unsigned n ) const {
    PcMaker pm( this );

    for( unsigned i = 0; i <= n; ++i )
        pm.add( pos[ i ], i );

    return pm.out();
}